

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar6;
  int *piVar7;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  uint count_00;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong __nmemb;
  ulong uVar14;
  uv_cpu_info_t *puVar15;
  unsigned_long user;
  uint local_474;
  uv_cpu_info_t **local_470;
  uint *local_468;
  unsigned_long irq;
  unsigned_long idle;
  unsigned_long sys;
  unsigned_long nice;
  unsigned_long dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
  pcVar5 = fgets(buf,0x400,__stream);
  if ((pcVar5 != (char *)0x0) && (pcVar5 = fgets(buf,0x400,__stream), pcVar5 != (char *)0x0)) {
    count_00 = 0;
    do {
      if (buf[2] != 'u' || buf._0_2_ != 0x7063) break;
      count_00 = count_00 + 1;
      pcVar5 = fgets(buf,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    if (count_00 != 0) {
      __nmemb = (ulong)count_00;
      local_470 = cpu_infos;
      local_468 = (uint *)count;
      cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
      if (cpu_infos_00 == (uv_cpu_info_t *)0x0) {
        iVar3 = -0xc;
      }
      else {
        pFVar6 = (FILE *)uv__open_file("/proc/cpuinfo");
        if (pFVar6 == (FILE *)0x0) {
          piVar7 = __errno_location();
          if (*piVar7 != 0) {
            iVar3 = -*piVar7;
            goto LAB_004e23ff;
          }
        }
        else {
          pcVar5 = fgets(buf,0x400,pFVar6);
          if (pcVar5 == (char *)0x0) {
            fclose(pFVar6);
LAB_004e2163:
            pcVar5 = "unknown";
            uVar14 = 0;
          }
          else {
            uVar12 = 0;
            uVar13 = 0;
            do {
              uVar12 = uVar12 & 0xffffffff;
              while ((__nmemb <= uVar13 ||
                     (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) != 0x203a09656d616e20 ||
                      CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) !=
                      0x616e206c65646f6d))) {
                uVar14 = uVar12;
                if ((uVar12 < __nmemb) &&
                   (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                    CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                    0x97a484d20757063)) {
                  iVar3 = atoi(buf + 0xb);
                  uVar14 = uVar12 + 1;
                  cpu_infos_00[uVar12].speed = iVar3;
                }
                pcVar5 = fgets(buf,0x400,pFVar6);
                uVar12 = uVar14;
                if (pcVar5 == (char *)0x0) {
                  fclose(pFVar6);
                  uVar14 = uVar13;
                  if (uVar13 != 0) goto LAB_004e2133;
                  goto LAB_004e2163;
                }
              }
              sVar8 = strlen(buf + 0xd);
              pcVar5 = uv__strndup(buf + 0xd,sVar8 - 1);
              if (pcVar5 == (char *)0x0) {
                fclose(pFVar6);
                goto LAB_004e23f9;
              }
              uVar14 = uVar13 + 1;
              cpu_infos_00[uVar13].model = pcVar5;
              pcVar5 = fgets(buf,0x400,pFVar6);
              uVar13 = uVar14;
            } while (pcVar5 != (char *)0x0);
            fclose(pFVar6);
LAB_004e2133:
            pcVar5 = cpu_infos_00[(int)uVar14 - 1].model;
          }
          if ((uint)uVar14 < count_00) {
            puVar15 = cpu_infos_00 + (uVar14 & 0xffffffff);
            lVar11 = __nmemb - (uVar14 & 0xffffffff);
            do {
              sVar8 = strlen(pcVar5);
              pcVar9 = uv__strndup(pcVar5,sVar8);
              if (pcVar9 == (char *)0x0) goto LAB_004e23f9;
              puVar15->model = pcVar9;
              puVar15 = puVar15 + 1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
        }
        lVar11 = sysconf(2);
        if (lVar11 == 0) {
          __assert_fail("clock_ticks != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x2db,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        if (lVar11 == -1) {
          __assert_fail("clock_ticks != (unsigned long) -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x2da,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        rewind(__stream);
        pcVar5 = fgets(buf,0x400,__stream);
        if (pcVar5 == (char *)0x0) goto LAB_004e240f;
        pcVar5 = fgets(buf,0x400,__stream);
        if (pcVar5 == (char *)0x0) {
          uVar13 = 0;
        }
        else {
          uVar12 = 0;
          while (uVar13 = uVar12, buf[2] == 'u' && buf._0_2_ == 0x7063) {
            iVar3 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
            if (iVar3 != 1) {
              __assert_fail("r == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                            ,0x2ef,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
            }
            uVar4 = 4;
            uVar10 = local_474;
            do {
              uVar4 = uVar4 + 1;
              bVar1 = 9 < uVar10;
              uVar10 = uVar10 / 10;
            } while (bVar1);
            iVar3 = __isoc99_sscanf(buf + uVar4,"%lu %lu %lu %lu %lu %lu",&user,&nice,&sys,&idle,
                                    &dummy,&irq);
            if (iVar3 != 6) goto LAB_004e240f;
            uVar13 = uVar12 + 1;
            cpu_infos_00[uVar12].cpu_times.user = user * lVar11;
            cpu_infos_00[uVar12].cpu_times.nice = nice * lVar11;
            cpu_infos_00[uVar12].cpu_times.sys = sys * lVar11;
            cpu_infos_00[uVar12].cpu_times.idle = idle * lVar11;
            cpu_infos_00[uVar12].cpu_times.irq = irq * lVar11;
            pcVar5 = fgets(buf,0x400,__stream);
            if ((pcVar5 == (char *)0x0) || (uVar12 = uVar13, __nmemb <= uVar13)) break;
          }
        }
        if ((uint)uVar13 != count_00) {
          __assert_fail("num == numcpus",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x30b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        if (cpu_infos_00->speed == 0) {
          piVar7 = &cpu_infos_00->speed;
          uVar13 = 0;
          do {
            snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                     uVar13 & 0xffffffff);
            pFVar6 = (FILE *)uv__open_file(buf);
            iVar3 = 0;
            if (pFVar6 != (FILE *)0x0) {
              iVar3 = __isoc99_fscanf(pFVar6,"%lu",&user);
              if (iVar3 != 1) {
                user = 0;
              }
              fclose(pFVar6);
              iVar3 = (int)(user / 1000);
            }
            *piVar7 = iVar3;
            uVar13 = uVar13 + 1;
            piVar7 = piVar7 + 0xe;
          } while (__nmemb != uVar13);
        }
        *local_470 = cpu_infos_00;
        *local_468 = count_00;
        iVar3 = 0;
      }
      goto LAB_004e20dc;
    }
  }
  iVar3 = -5;
LAB_004e20dc:
  iVar2 = fclose(__stream);
  if (iVar2 != 0) {
    piVar7 = __errno_location();
    if ((*piVar7 != 4) && (*piVar7 != 0x73)) {
LAB_004e240f:
      abort();
    }
  }
  return iVar3;
LAB_004e23f9:
  iVar3 = -0xc;
LAB_004e23ff:
  uv_free_cpu_info(cpu_infos_00,count_00);
  goto LAB_004e20dc;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}